

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall
GraphBuilder::getJoins
          (set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
           *__return_storage_ptr__,GraphBuilder *this)

{
  _Rb_tree_header *p_Var1;
  _Hash_node_base *p_Var2;
  value_type iterator;
  CallInst *local_28;
  _Hash_node_base *p_Stack_20;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (this->llvmToJoins_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    local_28 = (CallInst *)p_Var2[1]._M_nxt;
    p_Stack_20 = p_Var2[2]._M_nxt;
    std::
    _Rb_tree<llvm::CallInst_const*,llvm::CallInst_const*,std::_Identity<llvm::CallInst_const*>,std::less<llvm::CallInst_const*>,std::allocator<llvm::CallInst_const*>>
    ::_M_insert_unique<llvm::CallInst_const*const&>
              ((_Rb_tree<llvm::CallInst_const*,llvm::CallInst_const*,std::_Identity<llvm::CallInst_const*>,std::less<llvm::CallInst_const*>,std::allocator<llvm::CallInst_const*>>
                *)__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const CallInst *> GraphBuilder::getJoins() const {
    std::set<const CallInst *> llvmJoins;
    for (auto iterator : llvmToJoins_) {
        llvmJoins.insert(iterator.first);
    }
    return llvmJoins;
}